

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_alpn_list_contains_protocol
               (Span<const_unsigned_char> list,Span<const_unsigned_char> protocol)

{
  bool bVar1;
  int iVar2;
  CBS candidate;
  CBS cbs;
  CBS local_40;
  CBS local_30;
  
  local_30.len = list.size_;
  local_30.data = list.data_;
  while ((local_30.len != 0 && (iVar2 = CBS_get_u8_length_prefixed(&local_30,&local_40), iVar2 != 0)
         )) {
    bVar1 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                      (local_40.data,local_40.data + local_40.len,protocol.data_,
                       protocol.data_ + protocol.size_);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ssl_alpn_list_contains_protocol(Span<const uint8_t> list,
                                     Span<const uint8_t> protocol) {
  CBS cbs = list, candidate;
  while (CBS_len(&cbs) > 0) {
    if (!CBS_get_u8_length_prefixed(&cbs, &candidate)) {
      return false;
    }

    if (candidate == protocol) {
      return true;
    }
  }

  return false;
}